

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

iterator __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
erase(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      *this,const_iterator first,const_iterator last)

{
  undefined8 *puVar1;
  Rep *pRVar2;
  void **ppvVar3;
  int start;
  long lVar4;
  long lVar5;
  ulong uVar6;
  uint num;
  int iVar7;
  
  pRVar2 = (this->super_RepeatedPtrFieldBase).rep_;
  ppvVar3 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar3 = (void **)0x0;
  }
  lVar4 = ((long)first.it_ - (long)ppvVar3) * 0x20000000;
  start = (int)((ulong)((long)first.it_ - (long)ppvVar3) >> 3);
  iVar7 = (int)((ulong)((long)last.it_ - (long)ppvVar3) >> 3);
  num = iVar7 - start;
  if (num != 0 && start <= iVar7) {
    uVar6 = (ulong)num;
    lVar5 = lVar4 >> 0x20;
    do {
      if ((this->super_RepeatedPtrFieldBase).arena_ == (Arena *)0x0) {
        puVar1 = (undefined8 *)((this->super_RepeatedPtrFieldBase).rep_)->elements[lVar5];
        if ((puVar1 != (undefined8 *)0x0) && ((undefined8 *)*puVar1 != puVar1 + 2)) {
          operator_delete((undefined8 *)*puVar1);
        }
        operator_delete(puVar1);
      }
      uVar6 = uVar6 - 1;
      lVar5 = lVar5 + 1;
    } while (uVar6 != 0);
    internal::RepeatedPtrFieldBase::CloseGap(&this->super_RepeatedPtrFieldBase,start,num);
    pRVar2 = (this->super_RepeatedPtrFieldBase).rep_;
  }
  ppvVar3 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar3 = (void **)0x0;
  }
  return (iterator)(void **)((lVar4 >> 0x1d) + (long)ppvVar3);
}

Assistant:

inline typename RepeatedPtrField<Element>::iterator
RepeatedPtrField<Element>::erase(const_iterator first, const_iterator last) {
  size_type pos_offset = std::distance(cbegin(), first);
  size_type last_offset = std::distance(cbegin(), last);
  DeleteSubrange(pos_offset, last_offset - pos_offset);
  return begin() + pos_offset;
}